

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

bool_t hexIsValid(char *hex)

{
  bool_t bVar1;
  size_t sVar2;
  byte *in_RDI;
  bool_t local_4;
  
  bVar1 = strIsValid((char *)in_RDI);
  if ((bVar1 == 0) || (sVar2 = strLen((char *)0x1160f2), (sVar2 & 1) != 0)) {
    local_4 = 0;
  }
  else {
    for (; *in_RDI != 0; in_RDI = in_RDI + 1) {
      if (hex_dec_table[*in_RDI] == 0xff) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t hexIsValid(const char* hex)
{
	if (!strIsValid(hex) || strLen(hex) % 2)
		return FALSE;
	for (; *hex; ++hex)
		if (hex_dec_table[(octet)*hex] == 0xFF)
			return FALSE;
	return TRUE;
}